

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase173::run(TestCase173 *this)

{
  Builder builder;
  Builder local_3e8;
  Builder root1;
  Runnable local_398;
  Builder *local_390;
  Builder *local_388;
  Builder root2;
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  NullableValue<kj::Exception> local_178;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder1,0x400,GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder(&builder2,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root1,&builder1.super_MessageBuilder);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root2,&builder2.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&local_3e8,&root1);
  builder._builder.capTable = local_3e8._builder.capTable;
  builder._builder.segment = local_3e8._builder.segment;
  builder._builder.data = local_3e8._builder.data;
  builder._builder.pointers = local_3e8._builder.pointers;
  builder._builder.dataSize = local_3e8._builder.dataSize;
  builder._builder.pointerCount = local_3e8._builder.pointerCount;
  builder._builder._38_2_ = local_3e8._builder._38_2_;
  initTestMessage(builder);
  local_398._vptr_Runnable = (_func_int **)&PTR_run_00392910;
  local_390 = &root2;
  local_388 = &root1;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_178,&local_398);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_178);
  if ((local_178.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[118]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0xb5,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root2.adoptStructField(root1.disownStructField()); }) != nullptr\""
               ,(char (*) [118])
                "failed: expected ::kj::runCatchingExceptions([&]() { root2.adoptStructField(root1.disownStructField()); }) != nullptr"
              );
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder2);
  MallocMessageBuilder::~MallocMessageBuilder(&builder1);
  return;
}

Assistant:

TEST(Orphans, NoCrossMessageTransfers) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;
  auto root1 = builder1.initRoot<TestAllTypes>();
  auto root2 = builder2.initRoot<TestAllTypes>();

  initTestMessage(root1.initStructField());

  EXPECT_ANY_THROW(root2.adoptStructField(root1.disownStructField()));
}